

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3drv.h
# Opt level: O3

int __thiscall CTPNStmSwitch::gen_code_break(CTPNStmSwitch *this,textchar_t *lbl,size_t lbl_len)

{
  CTPNStmEnclosing *pCVar1;
  CTcCodeLabel *lbl_00;
  int iVar2;
  
  if (lbl == (textchar_t *)0x0) {
    lbl_00 = this->break_lbl_;
    iVar2 = 1;
    if (lbl_00 != (CTcCodeLabel *)0x0) {
      CTcGenTarg::write_op(G_cg,0x91);
      CTcCodeStream::write_ofs(G_cs,lbl_00,0,0);
    }
  }
  else {
    pCVar1 = (this->super_CTPNStmSwitchBase).super_CTPNStmEnclosing.enclosing_;
    if (pCVar1 != (CTPNStmEnclosing *)0x0) {
      iVar2 = (*(pCVar1->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
                _vptr_CTcPrsNodeBase[0x1f])();
      return iVar2;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

virtual int gen_code_break(const textchar_t *lbl, size_t lbl_len)
    {
        /* 
         *   if there's no label, and we don't have a 'break' label
         *   ourselves, it must mean that we're processing an unreachable
         *   'break' - we can simply do nothing in this case and pretend we
         *   succeeded 
         */
        if (lbl == 0 && break_lbl_ == 0)
            return TRUE;

        /* break to our break label */
        return gen_code_break_loop(break_lbl_, lbl, lbl_len);
    }